

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O0

Reader * __thiscall
capnp::MessageReader::getRootInternal(Reader *__return_storage_ptr__,MessageReader *this)

{
  PointerReader reader;
  SegmentReader *pSVar1;
  bool bVar2;
  ReaderArena *pRVar3;
  word *pwVar4;
  bool local_b1;
  PointerReader local_98;
  Fault local_68;
  Fault f;
  SegmentReader **local_58;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> local_50;
  bool local_25;
  SegmentId local_24;
  bool _kjCondition;
  SegmentReader *pSStack_20;
  SegmentReader *segment;
  MessageReader *local_10;
  MessageReader *this_local;
  
  local_10 = this;
  if ((this->allocatedArena & 1U) == 0) {
    pRVar3 = arena(this);
    segment = (SegmentReader *)this;
    kj::ctor<capnp::_::ReaderArena,capnp::MessageReader*>(pRVar3,(MessageReader **)&segment);
    this->allocatedArena = true;
  }
  pRVar3 = arena(this);
  kj::Id<unsigned_int,_capnp::_::Segment>::Id(&local_24,0);
  pSStack_20 = _::ReaderArena::tryGetSegment(pRVar3,local_24);
  local_58 = (SegmentReader **)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffffe0);
  f.exception = (Exception *)0x0;
  kj::_::DebugExpression<capnp::_::SegmentReader*&>::operator!=
            (&local_50,(DebugExpression<capnp::_::SegmentReader*&> *)&local_58,&f.exception);
  bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_50);
  pSVar1 = pSStack_20;
  local_b1 = false;
  if (bVar2) {
    pwVar4 = _::SegmentReader::getStartPtr(pSStack_20);
    local_b1 = _::SegmentReader::checkObject(pSVar1,pwVar4,1);
  }
  pSVar1 = pSStack_20;
  local_25 = local_b1;
  if (local_b1 == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[40]>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message.c++"
               ,0x65,FAILED,
               "segment != nullptr && segment->checkObject(segment->getStartPtr(), ONE * WORDS)",
               "_kjCondition,\"Message did not contain a root pointer.\"",&local_25,
               (char (*) [40])"Message did not contain a root pointer.");
    (__return_storage_ptr__->reader).pointer = (WirePointer *)0x0;
    *(undefined8 *)&(__return_storage_ptr__->reader).nestingLimit = 0;
    (__return_storage_ptr__->reader).segment = (SegmentReader *)0x0;
    (__return_storage_ptr__->reader).capTable = (CapTableReader *)0x0;
    AnyPointer::Reader::Reader(__return_storage_ptr__);
    kj::_::Debug::Fault::~Fault(&local_68);
  }
  else {
    pwVar4 = _::SegmentReader::getStartPtr(pSStack_20);
    _::PointerReader::getRoot
              (&local_98,pSVar1,(CapTableReader *)&(anonymous_namespace)::dummyCapTableReader,pwVar4
               ,(this->options).nestingLimit);
    reader.capTable = local_98.capTable;
    reader.segment = local_98.segment;
    reader.pointer = local_98.pointer;
    reader.nestingLimit = local_98.nestingLimit;
    reader._28_4_ = local_98._28_4_;
    AnyPointer::Reader::Reader(__return_storage_ptr__,reader);
  }
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Reader MessageReader::getRootInternal() {
  if (!allocatedArena) {
    static_assert(sizeof(_::ReaderArena) <= sizeof(arenaSpace),
        "arenaSpace is too small to hold a ReaderArena.  Please increase it.  This will break "
        "ABI compatibility.");
    kj::ctor(*arena(), this);
    allocatedArena = true;
  }

  _::SegmentReader* segment = arena()->tryGetSegment(_::SegmentId(0));
  KJ_REQUIRE(segment != nullptr &&
             segment->checkObject(segment->getStartPtr(), ONE * WORDS),
             "Message did not contain a root pointer.") {
    return AnyPointer::Reader();
  }

  // const_cast here is safe because dummyCapTableReader has no state.
  return AnyPointer::Reader(_::PointerReader::getRoot(
      segment, const_cast<DummyCapTableReader*>(&dummyCapTableReader),
      segment->getStartPtr(), options.nestingLimit));
}